

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O0

bool __thiscall ON_V4V5_MeshNgonList::V4V5_AddNgon(ON_V4V5_MeshNgonList *this,int N,int *vi,int *fi)

{
  ON_V4V5_MeshNgon *pOVar1;
  ON_V4V5_MeshNgon *ngon;
  int *fi_local;
  int *vi_local;
  int N_local;
  ON_V4V5_MeshNgonList *this_local;
  
  if ((vi == (int *)0x0) || (fi == (int *)0x0)) {
    this_local._7_1_ = false;
  }
  else {
    pOVar1 = V4V5_AddNgon(this,N);
    if (pOVar1 == (ON_V4V5_MeshNgon *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      memcpy(pOVar1->vi,vi,(long)N << 2);
      memcpy(pOVar1->fi,fi,(long)N << 2);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_V4V5_MeshNgonList::V4V5_AddNgon(int N, const int* vi, const int* fi)
{
  if ( 0 == vi || 0 == fi )
    return false;
  class ON_V4V5_MeshNgon* ngon = V4V5_AddNgon(N);
  if ( 0 == ngon )
    return false;
  memcpy(ngon->vi,vi,N*sizeof(ngon->vi[0]));
  memcpy(ngon->fi,fi,N*sizeof(ngon->fi[0]));
  return true;
}